

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O2

PropStatus __thiscall spvtools::opt::CCPPass::VisitPhi(CCPPass *this,Instruction *phi)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  iterator iVar3;
  mapped_type *pmVar4;
  uint32_t uVar5;
  mapped_type mVar6;
  mapped_type mVar7;
  uint32_t phi_arg_id;
  uint32_t local_34;
  
  uVar5 = 2;
  mVar6 = 0;
  _phi_arg_id = in_RAX;
  do {
    if ((uint)(((long)(phi->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(phi->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar5) {
      if (mVar6 != 0) {
        uVar5 = Instruction::result_id(phi);
        _phi_arg_id = CONCAT44(uVar5,phi_arg_id);
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->values_,&local_34);
        *pmVar4 = mVar6;
      }
      return (uint)(mVar6 != 0);
    }
    bVar1 = SSAPropagator::IsPhiArgExecutable
                      ((this->propagator_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::SSAPropagator,_std::default_delete<spvtools::opt::SSAPropagator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::SSAPropagator_*,_std::default_delete<spvtools::opt::SSAPropagator>_>
                       .super__Head_base<0UL,_spvtools::opt::SSAPropagator_*,_false>._M_head_impl,
                       phi,uVar5);
    mVar7 = mVar6;
    if (bVar1) {
      uVar2 = Instruction::GetSingleWordOperand(phi,uVar5);
      _phi_arg_id = CONCAT44(local_34,uVar2);
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->values_)._M_h,&phi_arg_id);
      if ((iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
           _M_cur != (__node_type *)0x0) &&
         ((mVar7 = *(mapped_type *)
                    ((long)iVar3.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur + 0xc), mVar7 == 0xffffffff ||
          ((mVar6 != 0 && (bVar1 = mVar7 != mVar6, mVar7 = mVar6, bVar1)))))) {
        MarkInstructionVarying(this,phi);
        return kVarying;
      }
    }
    uVar5 = uVar5 + 2;
    mVar6 = mVar7;
  } while( true );
}

Assistant:

SSAPropagator::PropStatus CCPPass::VisitPhi(Instruction* phi) {
  uint32_t meet_val_id = 0;

  // Implement the lattice meet operation. The result of this Phi instruction is
  // interesting only if the meet operation over arguments coming through
  // executable edges yields the same constant value.
  for (uint32_t i = 2; i < phi->NumOperands(); i += 2) {
    if (!propagator_->IsPhiArgExecutable(phi, i)) {
      // Ignore arguments coming through non-executable edges.
      continue;
    }
    uint32_t phi_arg_id = phi->GetSingleWordOperand(i);
    auto it = values_.find(phi_arg_id);
    if (it != values_.end()) {
      // We found an argument with a constant value.  Apply the meet operation
      // with the previous arguments.
      if (it->second == kVaryingSSAId) {
        // The "constant" value is actually a placeholder for varying. Return
        // varying for this phi.
        return MarkInstructionVarying(phi);
      } else if (meet_val_id == 0) {
        // This is the first argument we find.  Initialize the result to its
        // constant value id.
        meet_val_id = it->second;
      } else if (it->second == meet_val_id) {
        // The argument is the same constant value already computed. Continue
        // looking.
        continue;
      } else {
        // We either found a varying value, or another constant value different
        // from the previous computed meet value.  This Phi will never be
        // constant.
        return MarkInstructionVarying(phi);
      }
    } else {
      // The incoming value has no recorded value and is therefore not
      // interesting. A not interesting value joined with any other value is the
      // other value.
      continue;
    }
  }

  // If there are no incoming executable edges, the meet ID will still be 0. In
  // that case, return not interesting to evaluate the Phi node again.
  if (meet_val_id == 0) {
    return SSAPropagator::kNotInteresting;
  }

  // All the operands have the same constant value represented by |meet_val_id|.
  // Set the Phi's result to that value and declare it interesting.
  values_[phi->result_id()] = meet_val_id;
  return SSAPropagator::kInteresting;
}